

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

void set_occupation(_func_int *fn,char *txt,int xtime)

{
  _func_int **pp_Var1;
  
  if (xtime == 0) {
    pp_Var1 = &occupation;
  }
  else {
    occupation = timed_occupation;
    pp_Var1 = &timed_occ_fn;
  }
  *pp_Var1 = fn;
  occtxt = txt;
  occtime = 0;
  return;
}

Assistant:

void set_occupation(int (*fn)(void), const char *txt, int xtime)
{
	if (xtime) {
		occupation = timed_occupation;
		timed_occ_fn = fn;
	} else
		occupation = fn;
	occtxt = txt;
	occtime = 0;
	return;
}